

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar1;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *psVar2;
  scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator> *psVar3;
  FileDescriptor *pFVar4;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *psVar5;
  string *filename;
  char *__function;
  int i;
  long lVar6;
  long lVar7;
  string local_50;
  
  filename = *(string **)this->file_;
  StripProto(&local_50,filename);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n#include \"$basename$.pb.h\"\n\n#include <algorithm>\n\n#include <google/protobuf/stubs/common.h>\n#include <google/protobuf/stubs/once.h>\n#include <google/protobuf/io/coded_stream.h>\n#include <google/protobuf/wire_format_lite_inl.h>\n"
                     ,"filename",filename,"basename",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "#include <google/protobuf/descriptor.h>\n#include <google/protobuf/generated_message_reflection.h>\n#include <google/protobuf/reflection_ops.h>\n#include <google/protobuf/wire_format.h>\n"
                      );
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
  GenerateNamespaceOpeners(this,printer);
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"\nnamespace {\n\n");
    pFVar4 = this->file_;
    if (0 < *(int *)(pFVar4 + 0x48)) {
      lVar6 = 0;
      do {
        psVar1 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
                 ::operator[](&this->message_generators_,lVar6);
        if (psVar1->ptr_ == (MessageGenerator *)0x0) goto LAB_001b9c7a;
        MessageGenerator::GenerateDescriptorDeclarations(psVar1->ptr_,printer);
        lVar6 = lVar6 + 1;
        pFVar4 = this->file_;
        filename = (string *)(long)*(int *)(pFVar4 + 0x48);
      } while (lVar6 < (long)filename);
    }
    if (0 < *(int *)(pFVar4 + 0x58)) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        ClassName_abi_cxx11_
                  (&local_50,(cxx *)(*(long *)(pFVar4 + 0x60) + lVar6),(EnumDescriptor *)0x0,
                   SUB81(filename,0));
        io::Printer::Print(printer,
                           "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
                           "name",&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar7 = lVar7 + 1;
        pFVar4 = this->file_;
        filename = (string *)(long)*(int *)(pFVar4 + 0x58);
        lVar6 = lVar6 + 0x38;
      } while (lVar7 < (long)filename);
    }
    if (((0 < *(int *)(pFVar4 + 0x68)) && (*(int *)(*(long *)(pFVar4 + 0x88) + 0x50) != 3)) &&
       (*(char *)(*(long *)(pFVar4 + 0x88) + 0x56) == '\x01')) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        io::Printer::Print(printer,
                           "const ::google::protobuf::ServiceDescriptor* $name$_descriptor_ = NULL;\n"
                           ,"name",*(string **)(*(long *)(pFVar4 + 0x70) + lVar7));
        lVar6 = lVar6 + 1;
        pFVar4 = this->file_;
        lVar7 = lVar7 + 0x30;
      } while (lVar6 < *(int *)(pFVar4 + 0x68));
    }
    io::Printer::Print(printer,"\n}  // namespace\n\n");
  }
  GenerateBuildDescriptors(this,printer);
  pFVar4 = this->file_;
  if (0 < *(int *)(pFVar4 + 0x58)) {
    lVar6 = 0;
    do {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
               ::operator[](&this->enum_generators_,lVar6);
      if (psVar2->ptr_ == (EnumGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cxx::EnumGenerator]"
        ;
        goto LAB_001b9cd4;
      }
      EnumGenerator::GenerateMethods(psVar2->ptr_,printer);
      lVar6 = lVar6 + 1;
      pFVar4 = this->file_;
    } while (lVar6 < *(int *)(pFVar4 + 0x58));
  }
  if (0 < *(int *)(pFVar4 + 0x48)) {
    lVar6 = 0;
    do {
      io::Printer::Print(printer,"\n");
      io::Printer::Print(printer,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(printer,"\n");
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar6);
      if (psVar1->ptr_ == (MessageGenerator *)0x0) goto LAB_001b9c7a;
      MessageGenerator::GenerateClassMethods(psVar1->ptr_,printer);
      lVar6 = lVar6 + 1;
      pFVar4 = this->file_;
    } while (lVar6 < *(int *)(pFVar4 + 0x48));
  }
  if (((0 < *(int *)(pFVar4 + 0x68)) && (*(int *)(*(long *)(pFVar4 + 0x88) + 0x50) != 3)) &&
     (*(char *)(*(long *)(pFVar4 + 0x88) + 0x56) == '\x01')) {
    lVar6 = 0;
    do {
      if (lVar6 == 0) {
        io::Printer::Print(printer,"\n");
      }
      io::Printer::Print(printer,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(printer,"\n");
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>_>
               ::operator[](&this->service_generators_,lVar6);
      if (psVar3->ptr_ == (ServiceGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>::operator->() const [C = google::protobuf::compiler::cxx::ServiceGenerator]"
        ;
        goto LAB_001b9cd4;
      }
      ServiceGenerator::GenerateImplementation(psVar3->ptr_,printer);
      lVar6 = lVar6 + 1;
      pFVar4 = this->file_;
    } while (lVar6 < *(int *)(pFVar4 + 0x68));
  }
  if (0 < *(int *)(pFVar4 + 0x78)) {
    lVar6 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar6);
      if (psVar5->ptr_ == (ExtensionGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::cxx::ExtensionGenerator]"
        ;
        goto LAB_001b9cd4;
      }
      ExtensionGenerator::GenerateDefinition(psVar5->ptr_,printer);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(this->file_ + 0x78));
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n");
  GenerateNamespaceClosers(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n");
  return;
LAB_001b9c7a:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cxx::MessageGenerator]"
  ;
LAB_001b9cd4:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                ,0x1e2,__function);
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"

    // The generated code calls accessors that might be deprecated. We don't
    // want the compiler to warn in generated code.
    "#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n"
    "#include \"$basename$.pb.h\"\n"
    "\n"
    "#include <algorithm>\n"    // for swap()
    "\n"
    "#include <google/protobuf/stubs/common.h>\n"
    "#include <google/protobuf/stubs/once.h>\n"
    "#include <google/protobuf/io/coded_stream.h>\n"
    "#include <google/protobuf/wire_format_lite_inl.h>\n",
    "filename", file_->name(),
    "basename", StripProto(file_->name()));

  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "#include <google/protobuf/descriptor.h>\n"
      "#include <google/protobuf/generated_message_reflection.h>\n"
      "#include <google/protobuf/reflection_ops.h>\n"
      "#include <google/protobuf/wire_format.h>\n");
  }

  printer->Print(
    "// @@protoc_insertion_point(includes)\n");

  GenerateNamespaceOpeners(printer);

  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "\n"
      "namespace {\n"
      "\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateDescriptorDeclarations(printer);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      printer->Print(
        "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
        "name", ClassName(file_->enum_type(i), false));
    }

    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        printer->Print(
          "const ::google::protobuf::ServiceDescriptor* $name$_descriptor_ = NULL;\n",
          "name", file_->service(i)->name());
      }
    }

    printer->Print(
      "\n"
      "}  // namespace\n"
      "\n");
  }

  // Define our externally-visible BuildDescriptors() function.  (For the lite
  // library, all this does is initialize default instances.)
  GenerateBuildDescriptors(printer);

  // Generate enums.
  for (int i = 0; i < file_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  // Generate classes.
  for (int i = 0; i < file_->message_type_count(); i++) {
    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
    message_generators_[i]->GenerateClassMethods(printer);
  }

  if (HasGenericServices(file_)) {
    // Generate services.
    for (int i = 0; i < file_->service_count(); i++) {
      if (i == 0) printer->Print("\n");
      printer->Print(kThickSeparator);
      printer->Print("\n");
      service_generators_[i]->GenerateImplementation(printer);
    }
  }

  // Define extensions.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  GenerateNamespaceClosers(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}